

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O0

void getopt_add_bool(getopt_t *gopt,char sopt,char *lname,int def,char *help)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 *local_48;
  getopt_option_t *goo;
  char *sname_ptr;
  char *pcStack_30;
  char sname [2];
  char *help_local;
  char *pcStack_20;
  int def_local;
  char *lname_local;
  getopt_t *pgStack_10;
  char sopt_local;
  getopt_t *gopt_local;
  
  sname_ptr._7_1_ = 0;
  goo = (getopt_option_t *)((long)&sname_ptr + 6);
  sname_ptr._6_1_ = sopt;
  pcStack_30 = help;
  pcStack_20 = lname;
  lname_local._7_1_ = sopt;
  pgStack_10 = gopt;
  sVar2 = strlen(lname);
  if (sVar2 == 0) {
    fprintf(_stderr,"getopt_add_bool(): must supply option name\n");
    exit(1);
  }
  if (lname_local._7_1_ == '-') {
    fprintf(_stderr,"getopt_add_bool(): invalid option character: \'%c\'\n",0x2d);
    exit(1);
  }
  iVar1 = zhash_contains(pgStack_10->lopts,&stack0xffffffffffffffe0);
  if (iVar1 != 0) {
    fprintf(_stderr,"getopt_add_bool(): duplicate option name: --%s\n",pcStack_20);
    exit(1);
  }
  if (lname_local._7_1_ != '\0') {
    iVar1 = zhash_contains(pgStack_10->sopts,&goo);
    if (iVar1 != 0) {
      fprintf(_stderr,"getopt_add_bool(): duplicate option: -%s (\'%s\')\n",(long)&sname_ptr + 6,
              pcStack_20);
      exit(1);
    }
  }
  local_48 = (undefined8 *)calloc(1,0x30);
  pcVar3 = strdup((char *)((long)&sname_ptr + 6));
  *local_48 = pcVar3;
  pcVar3 = strdup(pcStack_20);
  local_48[1] = pcVar3;
  pcVar3 = "false";
  if (def != 0) {
    pcVar3 = "true";
  }
  pcVar3 = strdup(pcVar3);
  local_48[2] = pcVar3;
  *(undefined4 *)(local_48 + 4) = 1;
  pcVar3 = strdup(pcStack_30);
  local_48[3] = pcVar3;
  zhash_put(pgStack_10->lopts,local_48 + 1,&local_48,(void *)0x0,(void *)0x0);
  zhash_put(pgStack_10->sopts,local_48,&local_48,(void *)0x0,(void *)0x0);
  zarray_add(pgStack_10->options,&local_48);
  return;
}

Assistant:

void getopt_add_bool(getopt_t *gopt, char sopt, const char *lname, int def, const char *help)
{
    char sname[2];
    sname[0] = sopt;
    sname[1] = 0;
    char *sname_ptr = (char*) &sname;

    if (strlen(lname) < 1) { // must have long name
        fprintf (stderr, "getopt_add_bool(): must supply option name\n");
        exit (EXIT_FAILURE);
    }

    if (sopt == '-') { // short name cannot be '-' (no way to reference)
        fprintf (stderr, "getopt_add_bool(): invalid option character: '%c'\n", sopt);
        exit (EXIT_FAILURE);
    }

    if (zhash_contains(gopt->lopts, &lname)) {
        fprintf (stderr, "getopt_add_bool(): duplicate option name: --%s\n", lname);
        exit (EXIT_FAILURE);
    }

    if (sopt != '\0' && zhash_contains(gopt->sopts, &sname_ptr)) {
        fprintf (stderr, "getopt_add_bool(): duplicate option: -%s ('%s')\n", sname, lname);
        exit (EXIT_FAILURE);
    }

    getopt_option_t *goo = (getopt_option_t*) calloc(1, sizeof(getopt_option_t));
    goo->sname=strdup(sname);
    goo->lname=strdup(lname);
    goo->svalue=strdup(def ? "true" : "false");
    goo->type=GOO_BOOL_TYPE;
    goo->help=strdup(help);

    zhash_put(gopt->lopts, &goo->lname, &goo, NULL, NULL);
    zhash_put(gopt->sopts, &goo->sname, &goo, NULL, NULL);
    zarray_add(gopt->options, &goo);
}